

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpMeshHandler.c
# Opt level: O1

sbfBuffer_conflict sbfTcpMeshHandlerGetBuffer(sbfHandlerStream stream,size_t size)

{
  sbfBuffer_conflict psVar1;
  
  psVar1 = (sbfBuffer_conflict)sbfMemory_malloc(size + 0x48);
  psVar1->mAllocated = 1;
  psVar1->mDestroyCb = (sbfBufferDestroyCb)0x0;
  psVar1->mDestroyData = (void *)0x0;
  psVar1->mDestroyClosure = (void *)0x0;
  psVar1->mData = psVar1 + 1;
  psVar1->mSize = size;
  psVar1->mRefCount = 1;
  psVar1->mLocked = 0;
  psVar1->mOwner = (void *)0x0;
  return psVar1;
}

Assistant:

static sbfBuffer
sbfTcpMeshHandlerGetBuffer (sbfHandlerStream stream, size_t size)
{
    return sbfBuffer_new (NULL, size);
}